

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

cio_error cio_timer_cancel(cio_timer *timer)

{
  int iVar1;
  int *piVar2;
  undefined1 local_38 [4];
  int ret;
  itimerspec timeout;
  cio_timer *timer_local;
  
  if (timer->handler == (cio_timer_handler_t)0x0) {
    timer_local._4_4_ = CIO_OPERATION_NOT_PERMITTED;
  }
  else {
    timeout.it_value.tv_nsec = (__syscall_slong_t)timer;
    memset(local_38,0,0x20);
    iVar1 = timerfd_settime(*(int *)(timeout.it_value.tv_nsec + 0x30),0,(itimerspec *)local_38,
                            (itimerspec *)0x0);
    if (iVar1 == 0) {
      (**(code **)(timeout.it_value.tv_nsec + 8))
                (timeout.it_value.tv_nsec,*(undefined8 *)(timeout.it_value.tv_nsec + 0x10),
                 0xffffff83);
      *(undefined8 *)(timeout.it_value.tv_nsec + 8) = 0;
      timer_local._4_4_ = CIO_SUCCESS;
    }
    else {
      piVar2 = __errno_location();
      timer_local._4_4_ = -*piVar2;
    }
  }
  return timer_local._4_4_;
}

Assistant:

enum cio_error cio_timer_cancel(struct cio_timer *timer)
{
	struct itimerspec timeout;

	if (timer->handler == NULL) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	memset(&timeout, 0x0, sizeof(timeout));
	int ret = timerfd_settime(timer->impl.ev.fd, 0, &timeout, NULL);
	if (cio_likely(ret == 0)) {
		timer->handler(timer, timer->handler_context, CIO_OPERATION_ABORTED);
		timer->handler = NULL;
		return CIO_SUCCESS;
	}

	return (enum cio_error)(-errno);
}